

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O1

void __thiscall Qentem::QExpression::operator/=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  QExpression *pQVar3;
  double dVar4;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  
  if (this->Type == IntegerNumber) {
    pQVar3 = (QExpression *)(double)(long)(this->field_0).SubExpressions.storage_;
  }
  else {
    if (this->Type != NaturalNumber) goto LAB_0012cd11;
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(this->field_0).SubExpressions.storage_);
    pQVar3 = auVar2._0_8_;
  }
  (this->field_0).SubExpressions.storage_ = pQVar3;
  this->Type = RealNumber;
LAB_0012cd11:
  EVar1 = right->Type;
  if (EVar1 == RealNumber) {
    dVar4 = *(double *)&right->field_0;
  }
  else if (EVar1 == IntegerNumber) {
    dVar4 = (double)(long)(right->field_0).SubExpressions.storage_;
  }
  else {
    if (EVar1 != NaturalNumber) {
      return;
    }
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(right->field_0).SubExpressions.storage_);
    dVar4 = auVar2._0_8_;
  }
  *(double *)&this->field_0 = *(double *)&this->field_0 / dVar4;
  return;
}

Assistant:

void operator/=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                Value.Number.Real = double(Value.Number.Natural);
                Type              = ExpressionType::RealNumber;
                break;
            }

            case ExpressionType::IntegerNumber: {
                Value.Number.Real = double(Value.Number.Integer);
                Type              = ExpressionType::RealNumber;
                break;
            }

            default: {
            }
        }

        switch (right.Type) {
            case ExpressionType::NaturalNumber: {
                Value.Number.Real /= double(right.Value.Number.Natural);
                break;
            }

            case ExpressionType::IntegerNumber: {
                Value.Number.Real /= double(right.Value.Number.Integer);
                break;
            }

            case ExpressionType::RealNumber: {
                Value.Number.Real /= right.Value.Number.Real;
                break;
            }

            default: {
            }
        }
    }